

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

ON_String __thiscall ON_String::Duplicate(ON_String *this)

{
  ON_Internal_Empty_aString *pOVar1;
  ON_String *in_RSI;
  
  pOVar1 = &empty_astring;
  if (in_RSI->m_s != (char *)0x0) {
    pOVar1 = (ON_Internal_Empty_aString *)(in_RSI->m_s + -0xc);
  }
  if ((pOVar1->header).string_length < 1) {
    ON_String(this,&EmptyString);
  }
  else {
    ON_String(this,in_RSI);
    CopyArray(this);
  }
  return (ON_String)(char *)this;
}

Assistant:

const ON_String ON_String::Duplicate() const
{
  if (Length() <= 0)
    return ON_String::EmptyString;
  ON_String s = *this;
  s.CopyArray();
  return s;
}